

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O0

void __thiscall ObjectStore::~ObjectStore(ObjectStore *this)

{
  bool bVar1;
  reference ppOVar2;
  MutexFactory *mutex;
  __normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
  *in_RDI;
  iterator i;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffffb8;
  MutexFactory *in_stack_ffffffffffffffc0;
  __normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
  in_stack_ffffffffffffffd0;
  __normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
  local_20 [4];
  
  in_RDI->_M_current = (ObjectStoreToken **)&PTR__ObjectStore_00223a60;
  MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::clear
            ((vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)0x1d945b);
  local_20[0]._M_current =
       (ObjectStoreToken **)
       std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::begin
                 ((vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)
                  in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::end
              ((vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)
               in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
              ::operator*(local_20);
    in_stack_ffffffffffffffc0 = (MutexFactory *)*ppOVar2;
    if (in_stack_ffffffffffffffc0 != (MutexFactory *)0x0) {
      (*in_stack_ffffffffffffffc0->_vptr_MutexFactory[0xd])();
    }
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<ObjectStoreToken_**,_std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>_>
         ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffffc0);
  mutex = MutexFactory::i();
  MutexFactory::recycleMutex(in_stack_ffffffffffffffc0,(Mutex *)mutex);
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::~vector
            ((vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)
             in_stack_ffffffffffffffd0._M_current);
  std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::~vector
            ((vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)
             in_stack_ffffffffffffffd0._M_current);
  return;
}

Assistant:

ObjectStore::~ObjectStore()
{
	{
		MutexLocker lock(storeMutex);

		// Clean up
		tokens.clear();

		for (std::vector<ObjectStoreToken*>::iterator i = allTokens.begin(); i != allTokens.end(); i++)
		{
			delete *i;
		}
	}

	MutexFactory::i()->recycleMutex(storeMutex);
}